

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

void elf_writesections(GlobalVars *gv,FILE *f)

{
  node *pnVar1;
  node *pnVar2;
  
  pnVar1 = (node *)&gv->lnksec;
  pnVar2 = pnVar1;
  while (pnVar2 = pnVar2->next, pnVar2->next != (node *)0x0) {
    if (((ulong)pnVar2[2].next & 0x300) == 0x100) {
      fwritex(f,pnVar2[8].next,(size_t)pnVar2[5].next);
    }
  }
  while (pnVar1 = pnVar1->next, pnVar1->next != (node *)0x0) {
    if (((ulong)pnVar1[2].next & 0x300) == 0) {
      fwritex(f,pnVar1[8].next,(size_t)pnVar1[5].next);
    }
  }
  return;
}

Assistant:

void elf_writesections(struct GlobalVars *gv,FILE *f)
/* write all linked sections */
{
  struct LinkedSection *ls;

  /* write all allocated sections */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
  /* unallocated sections at last */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (!(ls->flags & SF_ALLOC)) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
}